

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O3

int __thiscall HashTable::Search(HashTable *this,Game *game)

{
  Game *pGVar1;
  bool *pbVar2;
  Game *pGVar3;
  size_t sVar4;
  size_t __n;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int k;
  ulong uVar9;
  int iVar10;
  
  iVar10 = game->id;
  iVar7 = this->hashSize;
  uVar9 = (long)iVar10 % (long)iVar7;
  pbVar2 = this->arrAddress;
  if (pbVar2[uVar9] == true) {
    do {
      uVar5 = (long)(int)((int)uVar9 +
                         (uint)(0x55555554 < iVar7 * -0x55555555 + 0x2aaaaaaaU) * 2 + 1) %
              (long)iVar7;
      uVar9 = uVar5 & 0xffffffff;
    } while (pbVar2[(int)uVar5] != false);
  }
  pGVar3 = this->games;
  iVar8 = (int)uVar9;
  if (pGVar3[iVar8].id == iVar10) {
    pGVar1 = pGVar3 + iVar8;
    sVar4 = (pGVar1->manufacturer)._M_string_length;
    __n = (game->manufacturer)._M_string_length;
    if (((sVar4 == __n) &&
        (((((sVar4 == 0 ||
            (iVar6 = bcmp((pGVar1->manufacturer)._M_dataplus._M_p,
                          (game->manufacturer)._M_dataplus._M_p,sVar4), iVar6 == 0)) &&
           (sVar4 = pGVar3[iVar8].date._M_string_length, sVar4 == (game->date)._M_string_length)) &&
          ((sVar4 == 0 ||
           (iVar6 = bcmp(pGVar3[iVar8].date._M_dataplus._M_p,(game->date)._M_dataplus._M_p,sVar4),
           iVar6 == 0)))) &&
         (sVar4 = pGVar3[iVar8].genre._M_string_length, sVar4 == (game->genre)._M_string_length))))
       && (((sVar4 == 0 ||
            (iVar6 = bcmp(pGVar3[iVar8].genre._M_dataplus._M_p,(game->genre)._M_dataplus._M_p,sVar4)
            , iVar6 == 0)) &&
           (sVar4 = (pGVar1->name)._M_string_length, sVar4 == (game->name)._M_string_length)))) {
      if (sVar4 == 0) {
        return iVar8;
      }
      iVar6 = bcmp((pGVar1->name)._M_dataplus._M_p,(game->name)._M_dataplus._M_p,sVar4);
      if (iVar6 == 0) {
        return iVar8;
      }
    }
    uVar9 = (long)(int)(iVar10 + (uint)(0x55555554 < iVar7 * -0x55555555 + 0x2aaaaaaaU) * 2 + 1) %
            (long)iVar7;
    iVar10 = (int)uVar9;
    uVar9 = uVar9 & 0xffffffff;
    game->id = iVar10;
    if (((((pGVar3[iVar10].manufacturer._M_string_length == __n) &&
          (((__n == 0 ||
            (iVar7 = bcmp(pGVar3[iVar10].manufacturer._M_dataplus._M_p,
                          (game->manufacturer)._M_dataplus._M_p,__n), iVar7 == 0)) &&
           (sVar4 = pGVar3[iVar10].date._M_string_length, sVar4 == (game->date)._M_string_length))))
         && ((sVar4 == 0 ||
             (iVar7 = bcmp(pGVar3[iVar10].date._M_dataplus._M_p,(game->date)._M_dataplus._M_p,sVar4)
             , iVar7 == 0)))) &&
        ((sVar4 = pGVar3[iVar10].genre._M_string_length, sVar4 == (game->genre)._M_string_length &&
         ((sVar4 == 0 ||
          (iVar7 = bcmp(pGVar3[iVar10].genre._M_dataplus._M_p,(game->genre)._M_dataplus._M_p,sVar4),
          iVar7 == 0)))))) &&
       (sVar4 = pGVar3[iVar10].name._M_string_length, sVar4 == (game->name)._M_string_length)) {
      if (sVar4 == 0) {
        return iVar10;
      }
      iVar7 = bcmp(pGVar3[iVar10].name._M_dataplus._M_p,(game->name)._M_dataplus._M_p,sVar4);
      if (iVar7 == 0) {
        return iVar10;
      }
    }
    iVar10 = 0;
    do {
      do {
        uVar9 = (long)(int)((int)uVar9 +
                            (uint)(0x55555554 < this->hashSize * -0x55555555 + 0x2aaaaaaaU) * 2 + 1)
                % (long)this->hashSize;
        iVar7 = (int)uVar9;
        uVar9 = uVar9 & 0xffffffff;
        game->id = iVar7;
      } while (pbVar2[iVar7] != false);
      if ((((pGVar3[iVar7].manufacturer._M_string_length == __n) &&
           (((__n == 0 ||
             (iVar8 = bcmp(pGVar3[iVar7].manufacturer._M_dataplus._M_p,
                           (game->manufacturer)._M_dataplus._M_p,__n), iVar8 == 0)) &&
            (sVar4 = pGVar3[iVar7].date._M_string_length, sVar4 == (game->date)._M_string_length))))
          && ((((sVar4 == 0 ||
                (iVar8 = bcmp(pGVar3[iVar7].date._M_dataplus._M_p,(game->date)._M_dataplus._M_p,
                              sVar4), iVar8 == 0)) &&
               (sVar4 = pGVar3[iVar7].genre._M_string_length,
               sVar4 == (game->genre)._M_string_length)) &&
              ((sVar4 == 0 ||
               (iVar8 = bcmp(pGVar3[iVar7].genre._M_dataplus._M_p,(game->genre)._M_dataplus._M_p,
                             sVar4), iVar8 == 0)))))) &&
         (sVar4 = pGVar3[iVar7].name._M_string_length, sVar4 == (game->name)._M_string_length)) {
        if (sVar4 == 0) {
          return iVar7;
        }
        iVar8 = bcmp(pGVar3[iVar7].name._M_dataplus._M_p,(game->name)._M_dataplus._M_p,sVar4);
        if (iVar8 == 0) {
          return iVar7;
        }
      }
      iVar10 = iVar10 + 1;
    } while (iVar10 != this->hashSize);
  }
  return -1;
}

Assistant:

int Search(Game game)
        {

            int index = key_hash_func(game.id, hashSize);
            if (arrAddress[index])
            {
                while (arrAddress[index])
                {
                    index = value_hash_func(index, hashSize);
                }
            }
                if (games[index].id == game.id)
                {
                    if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                    {
                        return index;
                    }
                    else
                    {
                        index = value_hash_func(game.id, hashSize);
                        if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                        {
                            return index;
                        }
                        int count = 0;
                        while (true)
                        {

                            index = value_hash_func(game.id, hashSize);
                            if (arrAddress[index])
                            {
                                continue;
                            }
                            else
                            {
                                count++;
                                if (games[index].manufacturer == game.manufacturer && games[index].date == game.date && games[index].genre == game.genre && games[index].name == game.name)
                                {
                                    return index;
                                }
                            }
                            if (count == hashSize)
                            {
                                break;
                            }
                        }

                    }
                }

            return -1;
        }